

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_swift.cpp
# Opt level: O0

void __thiscall
flatbuffers::swift::SwiftGenerator::GenerateEncoderBody(SwiftGenerator *this,StructDef *struct_def)

{
  bool bVar1;
  reference ppFVar2;
  bool local_47a;
  bool local_479;
  bool local_409;
  allocator<char> local_3f1;
  string local_3f0;
  allocator<char> local_3c9;
  string local_3c8;
  allocator<char> local_3a1;
  string local_3a0;
  allocator<char> local_379;
  string local_378;
  allocator<char> local_351;
  string local_350;
  allocator<char> local_329;
  string local_328;
  allocator<char> local_301;
  string local_300;
  Type local_2e0;
  Type local_2c0;
  allocator<char> local_299;
  string local_298;
  string local_278;
  allocator<char> local_251;
  string local_250;
  allocator<char> local_229;
  string local_228;
  allocator<char> local_201;
  string local_200;
  allocator<char> local_1d9;
  string local_1d8;
  string local_1b8;
  allocator<char> local_191;
  string local_190;
  allocator<char> local_169;
  string local_168;
  byte local_141;
  undefined1 local_140 [7];
  bool should_indent;
  allocator<char> local_119;
  string local_118;
  string local_f8;
  allocator<char> local_d1;
  string local_d0;
  Type local_b0;
  bool local_89;
  undefined1 auStack_88 [7];
  bool is_non_union_vector;
  Type type;
  FieldDef *field;
  __normal_iterator<flatbuffers::FieldDef_*const_*,_std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>_>
  local_58;
  const_iterator it;
  allocator<char> local_39;
  string local_38;
  StructDef *local_18;
  StructDef *struct_def_local;
  SwiftGenerator *this_local;
  
  local_18 = struct_def;
  struct_def_local = (StructDef *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,"var container = encoder.container(keyedBy: CodingKeys.self)",
             &local_39);
  CodeWriter::operator+=(&this->code_,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator(&local_39);
  local_58._M_current =
       (FieldDef **)
       std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>::begin
                 (&(local_18->fields).vec);
  do {
    field = (FieldDef *)
            std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>::end
                      (&(local_18->fields).vec);
    bVar1 = __gnu_cxx::operator!=
                      (&local_58,
                       (__normal_iterator<flatbuffers::FieldDef_*const_*,_std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>_>
                        *)&field);
    if (!bVar1) {
      return;
    }
    ppFVar2 = __gnu_cxx::
              __normal_iterator<flatbuffers::FieldDef_*const_*,_std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>_>
              ::operator*(&local_58);
    type._24_8_ = *ppFVar2;
    if ((((FieldDef *)type._24_8_)->deprecated & 1U) == 0) {
      auStack_88._0_4_ = (((FieldDef *)type._24_8_)->value).type.base_type;
      unique0x00012004 = (((FieldDef *)type._24_8_)->value).type.element;
      type._0_8_ = (((FieldDef *)type._24_8_)->value).type.struct_def;
      type.struct_def = (StructDef *)(((FieldDef *)type._24_8_)->value).type.enum_def;
      type.enum_def = *(EnumDef **)&(((FieldDef *)type._24_8_)->value).type.fixed_length;
      if (((((FieldDef *)type._24_8_)->value).type.base_type == BASE_TYPE_ARRAY) ||
         (local_409 = false, (((FieldDef *)type._24_8_)->value).type.base_type == BASE_TYPE_VECTOR))
      {
        Type::VectorType(&local_b0,&(((FieldDef *)type._24_8_)->value).type);
        local_409 = local_b0.base_type != BASE_TYPE_UTYPE;
      }
      local_89 = local_409;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_d0,"FIELDVAR",&local_d1);
      IdlNamer::Variable_abi_cxx11_(&local_f8,&this->namer_,(FieldDef *)type._24_8_);
      CodeWriter::SetValue(&this->code_,&local_d0,&local_f8);
      std::__cxx11::string::~string((string *)&local_f8);
      std::__cxx11::string::~string((string *)&local_d0);
      std::allocator<char>::~allocator(&local_d1);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_118,"CONSTANT",&local_119)
      ;
      SwiftConstant_abi_cxx11_((string *)local_140,this,(FieldDef *)type._24_8_);
      CodeWriter::SetValue(&this->code_,&local_118,(string *)local_140);
      std::__cxx11::string::~string((string *)local_140);
      std::__cxx11::string::~string((string *)&local_118);
      std::allocator<char>::~allocator(&local_119);
      local_141 = 1;
      if ((local_89 & 1U) == 0) {
        bVar1 = IsEnum((Type *)auStack_88);
        if ((!bVar1) || (bVar1 = FieldDef::IsOptional((FieldDef *)type._24_8_), bVar1)) {
          bVar1 = IsFloat(auStack_88._0_4_);
          if ((bVar1) && (bVar1 = StringIsFlatbufferNan((string *)(type._24_8_ + 0xe8)), bVar1)) {
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_200,"if !{{FIELDVAR}}.isNaN {",&local_201);
            CodeWriter::operator+=(&this->code_,&local_200);
            std::__cxx11::string::~string((string *)&local_200);
            std::allocator<char>::~allocator(&local_201);
          }
          else {
            bVar1 = IsScalar(auStack_88._0_4_);
            if ((bVar1) && (bVar1 = IsEnum((Type *)auStack_88), !bVar1)) {
              bVar1 = IsBool(auStack_88._0_4_);
              if ((!bVar1) && (bVar1 = FieldDef::IsOptional((FieldDef *)type._24_8_), !bVar1)) {
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_228,"if {{FIELDVAR}} != {{CONSTANT}} {",&local_229);
                CodeWriter::operator+=(&this->code_,&local_228);
                std::__cxx11::string::~string((string *)&local_228);
                std::allocator<char>::~allocator(&local_229);
                goto LAB_0036dee8;
              }
            }
            bVar1 = IsBool(auStack_88._0_4_);
            if ((!bVar1) || (bVar1 = FieldDef::IsOptional((FieldDef *)type._24_8_), bVar1)) {
              local_141 = 0;
            }
            else {
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_250,"CONSTANT",&local_251);
              SwiftConstant_abi_cxx11_(&local_278,this,(FieldDef *)type._24_8_);
              CodeWriter::SetValue(&this->code_,&local_250,&local_278);
              std::__cxx11::string::~string((string *)&local_278);
              std::__cxx11::string::~string((string *)&local_250);
              std::allocator<char>::~allocator(&local_251);
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_298,"if {{FIELDVAR}} != {{CONSTANT}} {",&local_299);
              CodeWriter::operator+=(&this->code_,&local_298);
              std::__cxx11::string::~string((string *)&local_298);
              std::allocator<char>::~allocator(&local_299);
            }
          }
        }
        else {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_190,"CONSTANT",&local_191);
          GenEnumDefaultValue_abi_cxx11_(&local_1b8,this,(FieldDef *)type._24_8_);
          CodeWriter::SetValue(&this->code_,&local_190,&local_1b8);
          std::__cxx11::string::~string((string *)&local_1b8);
          std::__cxx11::string::~string((string *)&local_190);
          std::allocator<char>::~allocator(&local_191);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_1d8,"if {{FIELDVAR}} != {{CONSTANT}} {",&local_1d9);
          CodeWriter::operator+=(&this->code_,&local_1d8);
          std::__cxx11::string::~string((string *)&local_1d8);
          std::allocator<char>::~allocator(&local_1d9);
        }
      }
      else {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_168,"if {{FIELDVAR}}Count > 0 {",&local_169);
        CodeWriter::operator+=(&this->code_,&local_168);
        std::__cxx11::string::~string((string *)&local_168);
        std::allocator<char>::~allocator(&local_169);
      }
LAB_0036dee8:
      if ((local_141 & 1) != 0) {
        Indent(this);
      }
      bVar1 = IsUnion((Type *)auStack_88);
      if ((!bVar1) || (bVar1 = IsEnum((Type *)auStack_88), bVar1)) {
        local_479 = false;
        if ((local_89 & 1U) != 0) {
          Type::VectorType(&local_2c0,(Type *)auStack_88);
          bVar1 = IsScalar(local_2c0.base_type);
          local_47a = true;
          if (bVar1) {
            Type::VectorType(&local_2e0,(Type *)auStack_88);
            local_47a = IsEnum(&local_2e0);
          }
          local_479 = local_47a;
        }
        if (local_479 == false) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_3c8,
                     "try container.encodeIfPresent({{FIELDVAR}}, forKey: .{{FIELDVAR}})",&local_3c9
                    );
          CodeWriter::operator+=(&this->code_,&local_3c8);
          std::__cxx11::string::~string((string *)&local_3c8);
          std::allocator<char>::~allocator(&local_3c9);
        }
        else {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_300,
                     "var contentEncoder = container.nestedUnkeyedContainer(forKey: .{{FIELDVAR}})",
                     &local_301);
          CodeWriter::operator+=(&this->code_,&local_300);
          std::__cxx11::string::~string((string *)&local_300);
          std::allocator<char>::~allocator(&local_301);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_328,"for index in 0..<{{FIELDVAR}}Count {",&local_329);
          CodeWriter::operator+=(&this->code_,&local_328);
          std::__cxx11::string::~string((string *)&local_328);
          std::allocator<char>::~allocator(&local_329);
          Indent(this);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_350,
                     "guard let type = {{FIELDVAR}}(at: index) else { continue }",&local_351);
          CodeWriter::operator+=(&this->code_,&local_350);
          std::__cxx11::string::~string((string *)&local_350);
          std::allocator<char>::~allocator(&local_351);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_378,"try contentEncoder.encode(type)",&local_379);
          CodeWriter::operator+=(&this->code_,&local_378);
          std::__cxx11::string::~string((string *)&local_378);
          std::allocator<char>::~allocator(&local_379);
          Outdent(this);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>((string *)&local_3a0,"}",&local_3a1);
          CodeWriter::operator+=(&this->code_,&local_3a0);
          std::__cxx11::string::~string((string *)&local_3a0);
          std::allocator<char>::~allocator(&local_3a1);
        }
      }
      else {
        GenerateEncoderUnionBody(this,(FieldDef *)type._24_8_);
      }
      if ((local_141 & 1) != 0) {
        Outdent(this);
      }
      if ((local_89 & 1U) == 0) {
        bVar1 = IsScalar(auStack_88._0_4_);
        if ((!bVar1) || (bVar1 = FieldDef::IsOptional((FieldDef *)type._24_8_), bVar1))
        goto LAB_0036e42b;
      }
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_3f0,"}",&local_3f1);
      CodeWriter::operator+=(&this->code_,&local_3f0);
      std::__cxx11::string::~string((string *)&local_3f0);
      std::allocator<char>::~allocator(&local_3f1);
    }
LAB_0036e42b:
    __gnu_cxx::
    __normal_iterator<flatbuffers::FieldDef_*const_*,_std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>_>
    ::operator++(&local_58);
  } while( true );
}

Assistant:

void GenerateEncoderBody(const StructDef &struct_def) {
    code_ += "var container = encoder.container(keyedBy: CodingKeys.self)";
    for (auto it = struct_def.fields.vec.begin();
         it != struct_def.fields.vec.end(); ++it) {
      const auto &field = **it;
      if (field.deprecated) continue;
      const auto type = field.value.type;

      const auto is_non_union_vector =
          (field.value.type.base_type == BASE_TYPE_ARRAY ||
           field.value.type.base_type == BASE_TYPE_VECTOR) &&
          field.value.type.VectorType().base_type != BASE_TYPE_UTYPE;

      code_.SetValue("FIELDVAR", namer_.Variable(field));
      code_.SetValue("CONSTANT", SwiftConstant(field));
      bool should_indent = true;
      if (is_non_union_vector) {
        code_ += "if {{FIELDVAR}}Count > 0 {";
      } else if (IsEnum(type) && !field.IsOptional()) {
        code_.SetValue("CONSTANT", GenEnumDefaultValue(field));
        code_ += "if {{FIELDVAR}} != {{CONSTANT}} {";
      } else if (IsFloat(type.base_type) &&
                 StringIsFlatbufferNan(field.value.constant)) {
        code_ += "if !{{FIELDVAR}}.isNaN {";
      } else if (IsScalar(type.base_type) && !IsEnum(type) &&
                 !IsBool(type.base_type) && !field.IsOptional()) {
        code_ += "if {{FIELDVAR}} != {{CONSTANT}} {";
      } else if (IsBool(type.base_type) && !field.IsOptional()) {
        code_.SetValue("CONSTANT", SwiftConstant(field));
        code_ += "if {{FIELDVAR}} != {{CONSTANT}} {";
      } else {
        should_indent = false;
      }
      if (should_indent) Indent();

      if (IsUnion(type) && !IsEnum(type)) {
        GenerateEncoderUnionBody(field);
      } else if (is_non_union_vector &&
                 (!IsScalar(type.VectorType().base_type) ||
                  IsEnum(type.VectorType()))) {
        code_ +=
            "var contentEncoder = container.nestedUnkeyedContainer(forKey: "
            ".{{FIELDVAR}})";
        code_ += "for index in 0..<{{FIELDVAR}}Count {";
        Indent();
        code_ += "guard let type = {{FIELDVAR}}(at: index) else { continue }";
        code_ += "try contentEncoder.encode(type)";
        Outdent();
        code_ += "}";
      } else {
        code_ +=
            "try container.encodeIfPresent({{FIELDVAR}}, forKey: "
            ".{{FIELDVAR}})";
      }
      if (should_indent) Outdent();

      if (is_non_union_vector ||
          (IsScalar(type.base_type) && !field.IsOptional())) {
        code_ += "}";
      }
    }
  }